

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

SQInteger __thiscall
SQVM::FallBackGet(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  SQObjectType SVar1;
  SQTable *pSVar2;
  bool bVar3;
  uint uVar4;
  AutoDec local_68;
  AutoDec ad;
  SQObjectPtr closure;
  SQObjectPtr local_40;
  SQObjectPtr *local_30;
  SQObjectPtr *dest_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQVM *this_local;
  
  SVar1 = (self->super_SQObject)._type;
  local_30 = dest;
  dest_local = key;
  key_local = self;
  self_local = (SQObjectPtr *)this;
  if ((SVar1 == OT_TABLE) || (SVar1 == OT_USERDATA)) {
    if ((((self->super_SQObject)._unVal.pTable)->super_SQDelegable)._delegate == (SQTable *)0x0) {
      return (SQInteger)(SQVM *)0x1;
    }
    ::SQObjectPtr::SQObjectPtr(&local_40,((self->super_SQObject)._unVal.pDelegable)->_delegate);
    bVar3 = Get(this,&local_40,dest_local,local_30,0,0x29a);
    ::SQObjectPtr::~SQObjectPtr(&local_40);
    if (bVar3) {
      return (SQInteger)(SQVM *)0x0;
    }
  }
  else if (SVar1 != OT_INSTANCE) {
    return (SQInteger)(SQVM *)0x1;
  }
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&ad);
  pSVar2 = (key_local->super_SQObject)._unVal.pTable;
  uVar4 = (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[6]
          )(pSVar2,this,7,(SQObjectPtr *)&ad);
  if ((uVar4 & 1) != 0) {
    Push(this,key_local);
    Push(this,dest_local);
    this->_nmetamethodscall = this->_nmetamethodscall + 1;
    AutoDec::AutoDec(&local_68,&this->_nmetamethodscall);
    bVar3 = Call(this,(SQObjectPtr *)&ad,2,this->_top + -2,local_30,0);
    if (bVar3) {
      Pop(this,2);
      this_local = (SQVM *)0x0;
      bVar3 = true;
    }
    else {
      Pop(this,2);
      if ((this->_lasterror).super_SQObject._type == OT_NULL) {
        bVar3 = false;
      }
      else {
        this_local = (SQVM *)0x2;
        bVar3 = true;
      }
    }
    AutoDec::~AutoDec(&local_68);
    if (bVar3) goto LAB_001408ca;
  }
  bVar3 = false;
LAB_001408ca:
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&ad);
  if (!bVar3) {
    return (SQInteger)(SQVM *)0x1;
  }
  return (SQInteger)this_local;
}

Assistant:

SQInteger SQVM::FallBackGet(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    switch(type(self)){
    case OT_TABLE:
    case OT_USERDATA:
        //delegation
        if(_delegable(self)->_delegate) {
            if(Get(SQObjectPtr(_delegable(self)->_delegate),key,dest,0,DONT_FALL_BACK)) return FALLBACK_OK;
        }
        else {
            return FALLBACK_NO_MATCH;
        }
        //go through
    case OT_INSTANCE: {
        SQObjectPtr closure;
        if(_delegable(self)->GetMetaMethod(this, MT_GET, closure)) {
            Push(self);Push(key);
            _nmetamethodscall++;
            AutoDec ad(&_nmetamethodscall);
            if(Call(closure, 2, _top - 2, dest, SQFalse)) {
                Pop(2);
                return FALLBACK_OK;
            }
            else {
                Pop(2);
                if(type(_lasterror) != OT_NULL) { //NULL means "clean failure" (not found)
                    return FALLBACK_ERROR;
                }
            }
        }
                      }
        break;
    default: break;//shutup GCC 4.x
    }
    // no metamethod or no fallback type
    return FALLBACK_NO_MATCH;
}